

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

ON_Xform * ON_Xform::TranslationTransformation(ON_Xform *__return_storage_ptr__,ON_3dVector *delta)

{
  ON_3dVector *delta_local;
  
  TranslationTransformation(__return_storage_ptr__,delta->x,delta->y,delta->z);
  return __return_storage_ptr__;
}

Assistant:

const ON_Xform ON_Xform::TranslationTransformation(
  const ON_3dVector& delta
)
{
  return ON_Xform::TranslationTransformation(delta.x, delta.y, delta.z);
}